

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::dumpProgramSPIRV
          (CLIntercept *this,cl_program program,uint64_t hash,bool modified,size_t length,void *il)

{
  double __x;
  SConfig *pSVar1;
  Services_Common *this_00;
  ulong uVar2;
  mapped_type *pmVar3;
  byte in_CL;
  ulong in_RDX;
  CLIntercept *in_RDI;
  float __x_00;
  SProgramInfo *programInfo;
  string command;
  char numberString [256];
  string fileName;
  lock_guard<std::mutex> lock;
  string *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  Services_Common *in_stack_fffffffffffffd50;
  char *__lhs_00;
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  char local_198 [232];
  size_t size;
  void *ptr;
  undefined1 hash_00;
  string *in_stack_ffffffffffffff68;
  CLIntercept *in_stack_ffffffffffffff70;
  string local_88 [32];
  string local_68 [79];
  byte local_19;
  ulong local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffd10,
             (mutex_type *)in_stack_fffffffffffffd08);
  pSVar1 = config(in_RDI);
  std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&pSVar1->DumpProgramSPIRV);
  std::__cxx11::string::string(local_68);
  OS(in_RDI);
  __lhs_00 = sc_DumpDirectoryName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,__lhs_00,(allocator *)&stack0xffffffffffffff77);
  ::OS::Services_Common::GetDumpDirectoryName
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  if ((local_19 & 1) != 0) {
    std::__cxx11::string::operator+=(local_68,"/Modified");
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  ptr = (void *)0x0;
  hash_00 = 0;
  local_198[0xe0] = '\0';
  local_198[0xe1] = '\0';
  local_198[0xe2] = '\0';
  local_198[0xe3] = '\0';
  local_198[0xe4] = '\0';
  local_198[0xe5] = '\0';
  local_198[0xe6] = '\0';
  local_198[0xe7] = '\0';
  size = 0;
  local_198[0xd0] = '\0';
  local_198[0xd1] = '\0';
  local_198[0xd2] = '\0';
  local_198[0xd3] = '\0';
  local_198[0xd4] = '\0';
  local_198[0xd5] = '\0';
  local_198[0xd6] = '\0';
  local_198[0xd7] = '\0';
  local_198[0xd8] = '\0';
  local_198[0xd9] = '\0';
  local_198[0xda] = '\0';
  local_198[0xdb] = '\0';
  local_198[0xdc] = '\0';
  local_198[0xdd] = '\0';
  local_198[0xde] = '\0';
  local_198[0xdf] = '\0';
  local_198[0xc0] = '\0';
  local_198[0xc1] = '\0';
  local_198[0xc2] = '\0';
  local_198[0xc3] = '\0';
  local_198[0xc4] = '\0';
  local_198[0xc5] = '\0';
  local_198[0xc6] = '\0';
  local_198[199] = '\0';
  local_198[200] = '\0';
  local_198[0xc9] = '\0';
  local_198[0xca] = '\0';
  local_198[0xcb] = '\0';
  local_198[0xcc] = '\0';
  local_198[0xcd] = '\0';
  local_198[0xce] = '\0';
  local_198[0xcf] = '\0';
  local_198[0xb0] = '\0';
  local_198[0xb1] = '\0';
  local_198[0xb2] = '\0';
  local_198[0xb3] = '\0';
  local_198[0xb4] = '\0';
  local_198[0xb5] = '\0';
  local_198[0xb6] = '\0';
  local_198[0xb7] = '\0';
  local_198[0xb8] = '\0';
  local_198[0xb9] = '\0';
  local_198[0xba] = '\0';
  local_198[0xbb] = '\0';
  local_198[0xbc] = '\0';
  local_198[0xbd] = '\0';
  local_198[0xbe] = '\0';
  local_198[0xbf] = '\0';
  local_198[0xa0] = '\0';
  local_198[0xa1] = '\0';
  local_198[0xa2] = '\0';
  local_198[0xa3] = '\0';
  local_198[0xa4] = '\0';
  local_198[0xa5] = '\0';
  local_198[0xa6] = '\0';
  local_198[0xa7] = '\0';
  local_198[0xa8] = '\0';
  local_198[0xa9] = '\0';
  local_198[0xaa] = '\0';
  local_198[0xab] = '\0';
  local_198[0xac] = '\0';
  local_198[0xad] = '\0';
  local_198[0xae] = '\0';
  local_198[0xaf] = '\0';
  local_198[0x90] = '\0';
  local_198[0x91] = '\0';
  local_198[0x92] = '\0';
  local_198[0x93] = '\0';
  local_198[0x94] = '\0';
  local_198[0x95] = '\0';
  local_198[0x96] = '\0';
  local_198[0x97] = '\0';
  local_198[0x98] = '\0';
  local_198[0x99] = '\0';
  local_198[0x9a] = '\0';
  local_198[0x9b] = '\0';
  local_198[0x9c] = '\0';
  local_198[0x9d] = '\0';
  local_198[0x9e] = '\0';
  local_198[0x9f] = '\0';
  local_198[0x80] = '\0';
  local_198[0x81] = '\0';
  local_198[0x82] = '\0';
  local_198[0x83] = '\0';
  local_198[0x84] = '\0';
  local_198[0x85] = '\0';
  local_198[0x86] = '\0';
  local_198[0x87] = '\0';
  local_198[0x88] = '\0';
  local_198[0x89] = '\0';
  local_198[0x8a] = '\0';
  local_198[0x8b] = '\0';
  local_198[0x8c] = '\0';
  local_198[0x8d] = '\0';
  local_198[0x8e] = '\0';
  local_198[0x8f] = '\0';
  local_198[0x70] = '\0';
  local_198[0x71] = '\0';
  local_198[0x72] = '\0';
  local_198[0x73] = '\0';
  local_198[0x74] = '\0';
  local_198[0x75] = '\0';
  local_198[0x76] = '\0';
  local_198[0x77] = '\0';
  local_198[0x78] = '\0';
  local_198[0x79] = '\0';
  local_198[0x7a] = '\0';
  local_198[0x7b] = '\0';
  local_198[0x7c] = '\0';
  local_198[0x7d] = '\0';
  local_198[0x7e] = '\0';
  local_198[0x7f] = '\0';
  local_198[0x60] = '\0';
  local_198[0x61] = '\0';
  local_198[0x62] = '\0';
  local_198[99] = '\0';
  local_198[100] = '\0';
  local_198[0x65] = '\0';
  local_198[0x66] = '\0';
  local_198[0x67] = '\0';
  local_198[0x68] = '\0';
  local_198[0x69] = '\0';
  local_198[0x6a] = '\0';
  local_198[0x6b] = '\0';
  local_198[0x6c] = '\0';
  local_198[0x6d] = '\0';
  local_198[0x6e] = '\0';
  local_198[0x6f] = '\0';
  local_198[0x50] = '\0';
  local_198[0x51] = '\0';
  local_198[0x52] = '\0';
  local_198[0x53] = '\0';
  local_198[0x54] = '\0';
  local_198[0x55] = '\0';
  local_198[0x56] = '\0';
  local_198[0x57] = '\0';
  local_198[0x58] = '\0';
  local_198[0x59] = '\0';
  local_198[0x5a] = '\0';
  local_198[0x5b] = '\0';
  local_198[0x5c] = '\0';
  local_198[0x5d] = '\0';
  local_198[0x5e] = '\0';
  local_198[0x5f] = '\0';
  local_198[0x40] = '\0';
  local_198[0x41] = '\0';
  local_198[0x42] = '\0';
  local_198[0x43] = '\0';
  local_198[0x44] = '\0';
  local_198[0x45] = '\0';
  local_198[0x46] = '\0';
  local_198[0x47] = '\0';
  local_198[0x48] = '\0';
  local_198[0x49] = '\0';
  local_198[0x4a] = '\0';
  local_198[0x4b] = '\0';
  local_198[0x4c] = '\0';
  local_198[0x4d] = '\0';
  local_198[0x4e] = '\0';
  local_198[0x4f] = '\0';
  local_198[0x30] = '\0';
  local_198[0x31] = '\0';
  local_198[0x32] = '\0';
  local_198[0x33] = '\0';
  local_198[0x34] = '\0';
  local_198[0x35] = '\0';
  local_198[0x36] = '\0';
  local_198[0x37] = '\0';
  local_198[0x38] = '\0';
  local_198[0x39] = '\0';
  local_198[0x3a] = '\0';
  local_198[0x3b] = '\0';
  local_198[0x3c] = '\0';
  local_198[0x3d] = '\0';
  local_198[0x3e] = '\0';
  local_198[0x3f] = '\0';
  local_198[0x20] = '\0';
  local_198[0x21] = '\0';
  local_198[0x22] = '\0';
  local_198[0x23] = '\0';
  local_198[0x24] = '\0';
  local_198[0x25] = '\0';
  local_198[0x26] = '\0';
  local_198[0x27] = '\0';
  local_198[0x28] = '\0';
  local_198[0x29] = '\0';
  local_198[0x2a] = '\0';
  local_198[0x2b] = '\0';
  local_198[0x2c] = '\0';
  local_198[0x2d] = '\0';
  local_198[0x2e] = '\0';
  local_198[0x2f] = '\0';
  local_198[0x10] = '\0';
  local_198[0x11] = '\0';
  local_198[0x12] = '\0';
  local_198[0x13] = '\0';
  local_198[0x14] = '\0';
  local_198[0x15] = '\0';
  local_198[0x16] = '\0';
  local_198[0x17] = '\0';
  local_198[0x18] = '\0';
  local_198[0x19] = '\0';
  local_198[0x1a] = '\0';
  local_198[0x1b] = '\0';
  local_198[0x1c] = '\0';
  local_198[0x1d] = '\0';
  local_198[0x1e] = '\0';
  local_198[0x1f] = '\0';
  local_198[0] = '\0';
  local_198[1] = '\0';
  local_198[2] = '\0';
  local_198[3] = '\0';
  local_198[4] = '\0';
  local_198[5] = '\0';
  local_198[6] = '\0';
  local_198[7] = '\0';
  local_198[8] = '\0';
  local_198[9] = '\0';
  local_198[10] = '\0';
  local_198[0xb] = '\0';
  local_198[0xc] = '\0';
  local_198[0xd] = '\0';
  local_198[0xe] = '\0';
  local_198[0xf] = '\0';
  pSVar1 = config(in_RDI);
  if ((pSVar1->OmitProgramNumber & 1U) == 0) {
    snprintf(local_198,0x100,"%04u_%08X_0000",(ulong)in_RDI->m_ProgramNumber,local_18 & 0xffffffff);
  }
  else {
    snprintf(local_198,0x100,"%08X_0000",local_18 & 0xffffffff);
  }
  std::__cxx11::string::operator+=(local_68,"/CLI_");
  std::__cxx11::string::operator+=(local_68,local_198);
  std::__cxx11::string::operator+=(local_68,".spv");
  this_00 = &OS(in_RDI)->super_Services_Common;
  ::OS::Services_Common::MakeDumpDirectories(this_00,in_stack_fffffffffffffd28);
  std::operator+(__lhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pSVar1);
  __x = (double)std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
  log(in_RDI,__x);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  dumpMemoryToFile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(bool)hash_00,ptr,size);
  config(in_RDI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    config(in_RDI);
    std::operator+(__lhs,(char *)this_00);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::string::~string(local_278);
    __x_00 = (float)std::__cxx11::string::c_str();
    logf(in_RDI,__x_00);
    OS(in_RDI);
    ::OS::Services::ExecuteCommand((Services *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::__cxx11::string::~string(local_1f8);
  }
  pmVar3 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[]((map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
                         *)pSVar1,(key_type *)in_stack_fffffffffffffd48);
  pmVar3->ProgramNumber = in_RDI->m_ProgramNumber;
  pmVar3->CompileCount = 0;
  in_RDI->m_ProgramNumber = in_RDI->m_ProgramNumber + 1;
  std::__cxx11::string::~string(local_68);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1fcf4c);
  return;
}

Assistant:

void CLIntercept::dumpProgramSPIRV(
    cl_program program,
    uint64_t hash,
    bool modified,
    const size_t length,
    const void* il )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().DumpProgramSPIRV );

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    if( modified )
    {
        fileName += "/Modified";
    }

    // Make the file name.  It will have the form:
    //   CLI_<program number>_<hash>_0000.spv
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_0000",
                (unsigned int)hash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_0000",
                m_ProgramNumber,
                (unsigned int)hash );
        }

        fileName += "/CLI_";
        fileName += numberString;
        fileName += ".spv";
    }

    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    // Dump the program source to a .spv file.
    {
        log( "Dumping program to file (inject): " + fileName + "\n" );
        dumpMemoryToFile(
            fileName,
            false,
            il,
            length );

        // Optionally, run spirv-dis to disassemble the dumped file.
        if( !config().SPIRVDis.empty() )
        {
            std::string command =
                config().SPIRVDis +
                " -o " + fileName + "asm" +
                " " + fileName;

            logf( "Running: %s\n", command.c_str() );
            OS().ExecuteCommand( command );
        }
    }

    SProgramInfo&   programInfo = m_ProgramInfoMap[ program ];
    programInfo.ProgramNumber = m_ProgramNumber;
    programInfo.CompileCount = 0;

    m_ProgramNumber++;
}